

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

void __thiscall
YAJLScan::MCU::MCU(MCU *this,bitio_stream *bstream,YAJLTables *tables,YAJLScanHeaderSpec *spec)

{
  byte bVar1;
  u16 uVar2;
  i16 iVar3;
  undefined1 auStack_58 [7];
  u8 ebits;
  YAJLEntropyTable ac_table;
  YAJLEntropyTable dc_table;
  YAJLScanHeaderSpec *spec_local;
  YAJLTables *tables_local;
  bitio_stream *bstream_local;
  MCU *this_local;
  
  MCU(this);
  this->component_id = spec->component_selector + 0xff;
  ac_table.arithmetic_table = *(YAJLArithmeticTable **)tables->etables[spec->dc_selector];
  bVar1 = spec->ac_selector;
  auStack_58._0_2_ = ((YAJLEntropyTable *)((long)(tables->etables + bVar1) + 0x18))->marker;
  unique0x00012002 =
       *(undefined6 *)&((YAJLEntropyTable *)((long)(tables->etables + bVar1) + 0x18))->field_0x2;
  ac_table._0_8_ = tables->etables[bVar1][1].huffman_table;
  ac_table.huffman_table = (YAJLHuffmanTable *)tables->etables[bVar1][1].arithmetic_table;
  uVar2 = YAJLEntropyTable::decode((YAJLEntropyTable *)&ac_table.arithmetic_table);
  iVar3 = extract_xv(this,bstream,(u8)uVar2);
  this->xcof[0] = iVar3;
  fill_xac(this,bstream,(YAJLEntropyTable *)auStack_58);
  return;
}

Assistant:

YAJLScan::MCU::MCU(bitio::bitio_stream *bstream, YAJLTables *tables, YAJLScanHeaderSpec *spec) : MCU() {
    component_id = spec->component_selector - 1;
    auto dc_table = tables->etables[spec->dc_selector][0];
    auto ac_table = tables->etables[spec->ac_selector][1];
    u8 ebits = dc_table.decode();
    xcof[0] = extract_xv(bstream, ebits);
    fill_xac(bstream, &ac_table);
}